

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O1

void slang::setBits(uint64_t *dest,uint32_t destOffset,uint32_t length)

{
  uint uVar1;
  uint uVar2;
  ulong *__s;
  ulong uVar3;
  
  if (length != 0) {
    __s = dest + (destOffset >> 6);
    uVar2 = destOffset & 0x3f;
    if (uVar2 != 0) {
      uVar1 = 0x40 - uVar2;
      if (length <= 0x40 - uVar2) {
        uVar1 = length;
      }
      length = length - uVar1;
      *__s = *__s | ~(-1L << ((byte)uVar1 & 0x3f)) << (sbyte)uVar2;
      __s = __s + 1;
    }
    if (0x3f < length) {
      uVar3 = (ulong)((length >> 6) - 1);
      memset(__s,0xff,uVar3 * 8 + 8);
      __s = __s + uVar3 + 1;
    }
    if ((length & 0x3f) != 0) {
      *__s = *__s | ~(-1L << (sbyte)(length & 0x3f));
    }
  }
  return;
}

Assistant:

static void setBits(uint64_t* dest, uint32_t destOffset, uint32_t length) {
    if (length == 0)
        return;

    // Get the first word we want to write to, and the remaining bits are an offset.
    const uint32_t BitsPerWord = SVInt::BITS_PER_WORD;
    dest += destOffset / BitsPerWord;
    destOffset %= BitsPerWord;

    // Writing to the first word is a special case, due to the bit offset
    if (destOffset) {
        uint32_t bitsToWrite = std::min(length, BitsPerWord - destOffset);
        length -= bitsToWrite;

        *dest |= ((1ull << bitsToWrite) - 1) << destOffset;
        dest++;
    }

    // Do a bulk set of whole words, with all writes to dest word-aligned.
    for (uint32_t i = 0; i < length / BitsPerWord; i++)
        *dest++ = UINT64_MAX;

    // Handle leftover bits in the final word.
    if (length %= BitsPerWord)
        *dest |= (1ull << length) - 1;
}